

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
::clear(raw_hash_set<phmap::priv::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
        *this)

{
  long *plVar1;
  long *plVar2;
  size_t i;
  size_t sVar3;
  size_t sVar4;
  long lVar5;
  
  if (this->size_ == 0) {
    return;
  }
  sVar4 = this->capacity_;
  if (sVar4 != 0) {
    lVar5 = 0x10;
    sVar3 = 0;
    do {
      if (-1 < this->ctrl_[sVar3]) {
        plVar1 = *(long **)((long)this->slots_ + lVar5 + -0x10);
        plVar2 = (long *)((long)this->slots_ + lVar5);
        if (plVar2 != plVar1) {
          operator_delete(plVar1,*plVar2 + 1);
          sVar4 = this->capacity_;
        }
      }
      sVar3 = sVar3 + 1;
      lVar5 = lVar5 + 0x28;
    } while (sVar3 != sVar4);
    this->size_ = 0;
    memset(this->ctrl_,0x80,sVar4 + 0x10);
    this->ctrl_[sVar4] = -1;
    reset_growth_left(this,this->capacity_);
    if (this->size_ == 0) {
      return;
    }
  }
  __assert_fail("empty()",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                ,0x50a,
                "void phmap::priv::raw_hash_set<phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, phmap::priv::StatefulTestingHash, phmap::priv::StatefulTestingEqual, phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>>::clear() [Policy = phmap::priv::FlatHashMapPolicy<std::basic_string<char>, int>, Hash = phmap::priv::StatefulTestingHash, Eq = phmap::priv::StatefulTestingEqual, Alloc = phmap::priv::Alloc<std::pair<const std::basic_string<char>, int>>]"
               );
}

Assistant:

bool empty() const { return !size(); }